

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall Parser::Load(Parser *this,string *filename,string *err,Lexer *parent)

{
  Metrics *this_00;
  int iVar1;
  Metric *pMVar2;
  undefined1 uVar3;
  string contents;
  string read_err;
  ScopedMetric metrics_h_scoped;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ScopedMetric local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::metrics_h_metric == '\0') {
    iVar1 = __cxa_guard_acquire(&Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::
                                 metrics_h_metric);
    this_00 = g_metrics;
    if (iVar1 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar2 = (Metric *)0x0;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,".ninja parse",(allocator<char> *)&local_98);
        pMVar2 = Metrics::NewMetric(this_00,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      Load::metrics_h_metric = pMVar2;
      __cxa_guard_release(&Load(std::__cxx11::string_const&,std::__cxx11::string*,Lexer*)::
                           metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_78,Load::metrics_h_metric);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_98.field_2._M_local_buf[0] = '\0';
  iVar1 = (**(code **)(*(long *)this->file_reader_ + 0x10))
                    (this->file_reader_,filename,&local_d8,&local_98);
  if (iVar1 == 0) {
    std::__cxx11::string::resize((ulong)&local_d8);
    iVar1 = (**this->_vptr_Parser)(this,filename,&local_d8,err);
    uVar3 = (undefined1)iVar1;
  }
  else {
    std::operator+(&local_68,"loading \'",filename);
    std::operator+(&local_48,&local_68,"\': ");
    std::operator+(&local_b8,&local_48,&local_98);
    std::__cxx11::string::operator=((string *)err,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    if (parent != (Lexer *)0x0) {
      std::__cxx11::string::string((string *)&local_b8,(string *)err);
      Lexer::Error(parent,&local_b8,err);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    uVar3 = 0;
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  ScopedMetric::~ScopedMetric(&local_78);
  return (bool)uVar3;
}

Assistant:

bool Parser::Load(const string& filename, string* err, Lexer* parent) {
  METRIC_RECORD(".ninja parse");
  string contents;
  string read_err;
  if (file_reader_->ReadFile(filename, &contents, &read_err) !=
      FileReader::Okay) {
    *err = "loading '" + filename + "': " + read_err;
    if (parent)
      parent->Error(string(*err), err);
    return false;
  }

  // The lexer needs a nul byte at the end of its input, to know when it's done.
  // It takes a StringPiece, and StringPiece's string constructor uses
  // string::data().  data()'s return value isn't guaranteed to be
  // null-terminated (although in practice - libc++, libstdc++, msvc's stl --
  // it is, and C++11 demands that too), so add an explicit nul byte.
  contents.resize(contents.size() + 1);

  return Parse(filename, contents, err);
}